

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_NtkPrintDistrib(Cba_Ntk_t *p,int fVerbose)

{
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *p_00;
  Cba_Ntk_t *pCVar2;
  int iVar3;
  Cba_ObjType_t CVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Vec_Wrd_t *pVVar10;
  char *pcVar11;
  Vec_Wrd_t *p_01;
  word wVar12;
  double dVar13;
  Vec_Wrd_t *vOccur;
  Vec_Wrd_t *vType;
  char *pTypeNames [90];
  word wStack_58;
  Cba_ObjType_t Type;
  word Sign;
  int local_48;
  int s1;
  int s0;
  int s;
  int k;
  int i;
  int nCountRange;
  int iRnObj;
  Vec_Int_t *vAnds;
  Vec_Ptr_t *vOccurs;
  Vec_Ptr_t *vTypes;
  Cba_Ntk_t *pCStack_10;
  int fVerbose_local;
  Cba_Ntk_t *p_local;
  
  vTypes._4_4_ = fVerbose;
  pCStack_10 = p;
  _nCountRange = Vec_IntStart(0x5a);
  i = -1;
  k = 0;
  Cba_ManCreatePrimMap((char **)&vType);
  vOccurs = Vec_PtrStart(0x5a);
  vAnds = (Vec_Int_t *)Vec_PtrStart(0x5a);
  for (s = 0; p_00 = vOccurs, iVar7 = s, s < 0x5a; s = s + 1) {
    pVVar10 = Vec_WrdAlloc(0x10);
    Vec_PtrWriteEntry(p_00,iVar7,pVVar10);
  }
  for (s = 0; pVVar1 = vAnds, iVar7 = s, s < 0x5a; s = s + 1) {
    pVVar10 = Vec_WrdAlloc(0x10);
    Vec_PtrWriteEntry((Vec_Ptr_t *)pVVar1,iVar7,pVVar10);
  }
  s = 1;
  do {
    iVar7 = s;
    iVar3 = Vec_StrSize(&pCStack_10->vObjType);
    if (iVar3 <= iVar7) {
      if (k != 0) {
        printf("Warning: %d objects of the design have non-zero-based ranges.\n",(ulong)(uint)k);
        pCVar2 = pCStack_10;
        iVar7 = i;
        iVar3 = Cba_ObjFon0(pCStack_10,i);
        pcVar11 = Cba_FonNameStr(pCVar2,iVar3);
        uVar5 = Cba_ObjRangeSize(pCStack_10,i);
        uVar6 = Cba_ObjLeft(pCStack_10,i);
        uVar9 = Cba_ObjRight(pCStack_10,i);
        printf("In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n",
               (ulong)(uint)iVar7,pcVar11,(ulong)uVar5,(ulong)uVar6,(ulong)uVar9);
      }
      printf(
            "ID  :  name  occurrence    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n"
            );
      for (s = 0; s < 0x5a; s = s + 1) {
        pVVar10 = (Vec_Wrd_t *)Vec_PtrEntry(vOccurs,s);
        p_01 = (Vec_Wrd_t *)Vec_PtrEntry((Vec_Ptr_t *)vAnds,s);
        iVar7 = s;
        if (pCStack_10->pDesign->nObjs[s] != 0) {
          pcVar11 = pTypeNames[(long)s + -1];
          uVar5 = pCStack_10->pDesign->nObjs[s];
          uVar6 = Vec_IntEntry(_nCountRange,s);
          printf("%2d  :  %-8s  %6d%8d ",(ulong)(uint)iVar7,pcVar11,(ulong)uVar5,(ulong)uVar6);
          Cba_NtkPrintDistribSortOne(vOccurs,(Vec_Ptr_t *)vAnds,s);
          for (s0 = 0; iVar7 = s0, iVar3 = Vec_WrdSize(pVVar10), iVar7 < iVar3; s0 = s0 + 1) {
            wVar12 = Vec_WrdEntry(pVVar10,s0);
            Cba_NtkPrintDistribFromSign(wVar12,&s1,&local_48,(int *)((long)&Sign + 4));
            if (((s0 % 6 == 5) && (Sign._4_4_ != 0)) || ((s0 % 8 == 7 && (Sign._4_4_ == 0)))) {
              printf("\n                                ");
            }
            wVar12 = Vec_WrdEntry(p_01,s0);
            printf("(%d)",wVar12 & 0xffffffff);
            iVar7 = Abc_LitIsCompl(s1);
            pcVar11 = "";
            if (iVar7 != 0) {
              pcVar11 = "-";
            }
            uVar5 = Abc_Lit2Var(s1);
            printf("%s%d",pcVar11,(ulong)uVar5);
            if (local_48 != 0) {
              iVar7 = Abc_LitIsCompl(local_48);
              pcVar11 = "";
              if (iVar7 != 0) {
                pcVar11 = "-";
              }
              uVar5 = Abc_Lit2Var(local_48);
              printf("=%s%d",pcVar11,(ulong)uVar5);
            }
            if (Sign._4_4_ != 0) {
              iVar7 = Abc_LitIsCompl(Sign._4_4_);
              pcVar11 = "";
              if (iVar7 != 0) {
                pcVar11 = "-";
              }
              uVar5 = Abc_Lit2Var(Sign._4_4_);
              printf(".%s%d",pcVar11,(ulong)uVar5);
            }
            printf(" ");
          }
          printf("\n");
        }
      }
      Vec_VecFree((Vec_Vec_t *)vOccurs);
      Vec_VecFree((Vec_Vec_t *)vAnds);
      Vec_IntFree(_nCountRange);
      return;
    }
    CVar4 = Cba_ObjType(pCStack_10,s);
    if (CVar4 != CBA_OBJ_NONE) {
      CVar4 = Cba_ObjType(pCStack_10,s);
      iVar3 = Cba_ObjSign(pCStack_10,s);
      iVar7 = s;
      if (0x1fffff < iVar3) {
        uVar5 = Cba_ObjRangeSize(pCStack_10,s);
        uVar6 = Cba_ObjRangeSize(pCStack_10,s);
        printf("Object %6d has range %d, which is reduced to %d in the statistics.\n",
               (ulong)(uint)iVar7,(ulong)uVar5,(ulong)(uVar6 & 0xfffff));
      }
      iVar7 = Cba_ObjLeft(pCStack_10,s);
      if ((iVar7 != 0) && (iVar7 = Cba_ObjRight(pCStack_10,s), iVar7 != 0)) {
        if (i == -1) {
          i = 1;
        }
        k = k + 1;
      }
      iVar7 = Cba_ObjIsPi(pCStack_10,s);
      if (iVar7 == 0) {
        if (CVar4 == CBA_BOX_BUF) {
          iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
          iVar7 = Cba_FonIsConst(iVar7);
          if (iVar7 != 0) goto LAB_00446589;
        }
        if (CVar4 == CBA_BOX_CONCAT) goto LAB_00446589;
        iVar7 = Cba_TypeIsUnary(CVar4);
        if (iVar7 == 0) {
          iVar7 = Cba_ObjFinNum(pCStack_10,s);
          if (iVar7 == 1) {
            iVar7 = Cba_ObjSign(pCStack_10,s);
            pCVar2 = pCStack_10;
            iVar3 = Cba_ObjFinFon(pCStack_10,s,0);
            iVar3 = Cba_ObjSign(pCVar2,iVar3);
            wStack_58 = Cba_NtkPrintDistribMakeSign(iVar7,iVar3,0);
          }
          else {
            iVar7 = Cba_ObjFinNum(pCStack_10,s);
            if (iVar7 < 2) {
              __assert_fail("Cba_ObjFinNum(p, i) >= 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                            ,0x82,"void Cba_NtkPrintDistrib(Cba_Ntk_t *, int)");
            }
            iVar7 = Cba_ObjSign(pCStack_10,s);
            pCVar2 = pCStack_10;
            iVar3 = Cba_ObjFinFon(pCStack_10,s,0);
            iVar3 = Cba_ObjSign(pCVar2,iVar3);
            pCVar2 = pCStack_10;
            iVar8 = Cba_ObjFinFon(pCStack_10,s,1);
            iVar8 = Cba_ObjSign(pCVar2,iVar8);
            wStack_58 = Cba_NtkPrintDistribMakeSign(iVar7,iVar3,iVar8);
          }
        }
        else {
          iVar7 = Cba_ObjSign(pCStack_10,s);
          pCVar2 = pCStack_10;
          iVar3 = Cba_ObjFinFon(pCStack_10,s,0);
          iVar3 = Cba_ObjSign(pCVar2,iVar3);
          wStack_58 = Cba_NtkPrintDistribMakeSign(iVar7,iVar3,0);
        }
      }
      else {
LAB_00446589:
        iVar7 = Cba_ObjSign(pCStack_10,s);
        wStack_58 = Cba_NtkPrintDistribMakeSign(iVar7,0,0);
      }
      Cba_NtkPrintDistribAddOne(vOccurs,(Vec_Ptr_t *)vAnds,CVar4,wStack_58);
      pCVar2 = pCStack_10;
      pVVar1 = _nCountRange;
      if (CVar4 == CBA_BOX_MUX) {
        iVar7 = Cba_ObjRangeSize(pCStack_10,s);
        iVar3 = Cba_ObjFinNum(pCStack_10,s);
        Vec_IntAddToEntry(pVVar1,0x12,iVar7 * 3 * (iVar3 + -2));
      }
      else if (CVar4 == CBA_BOX_SHIR) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        uVar5 = Cba_ObjRangeSize(pCStack_10,s);
        iVar3 = Abc_Base2Log(uVar5);
        iVar7 = Abc_MinInt(iVar7,iVar3);
        Vec_IntAddToEntry(pVVar1,0x42,iVar7 * 3);
      }
      else if (CVar4 == CBA_BOX_SHIRA) {
        iVar7 = Cba_ObjRangeSize(pCStack_10,s);
        pCVar2 = pCStack_10;
        iVar3 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar3 = Cba_ObjRangeSize(pCVar2,iVar3);
        uVar5 = Cba_ObjRangeSize(pCStack_10,s);
        iVar8 = Abc_Base2Log(uVar5);
        iVar3 = Abc_MinInt(iVar3,iVar8);
        Vec_IntAddToEntry(pVVar1,0x44,iVar7 * iVar3 * 3);
      }
      else if (CVar4 == CBA_BOX_SHIL) {
        iVar7 = Cba_ObjRangeSize(pCStack_10,s);
        pCVar2 = pCStack_10;
        iVar3 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar3 = Cba_ObjRangeSize(pCVar2,iVar3);
        uVar5 = Cba_ObjRangeSize(pCStack_10,s);
        iVar8 = Abc_Base2Log(uVar5);
        iVar3 = Abc_MinInt(iVar3,iVar8);
        Vec_IntAddToEntry(pVVar1,0x41,iVar7 * iVar3 * 3);
      }
      else if (CVar4 == CBA_BOX_SHILA) {
        iVar7 = Cba_ObjRangeSize(pCStack_10,s);
        pCVar2 = pCStack_10;
        iVar3 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar3 = Cba_ObjRangeSize(pCVar2,iVar3);
        uVar5 = Cba_ObjRangeSize(pCStack_10,s);
        iVar8 = Abc_Base2Log(uVar5);
        iVar3 = Abc_MinInt(iVar3,iVar8);
        Vec_IntAddToEntry(pVVar1,0x43,iVar7 * iVar3 * 3);
      }
      else if (CVar4 == CBA_BOX_ROTR) {
        iVar7 = Cba_ObjRangeSize(pCStack_10,s);
        pCVar2 = pCStack_10;
        iVar3 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar3 = Cba_ObjRangeSize(pCVar2,iVar3);
        uVar5 = Cba_ObjRangeSize(pCStack_10,s);
        iVar8 = Abc_Base2Log(uVar5);
        iVar3 = Abc_MinInt(iVar3,iVar8);
        Vec_IntAddToEntry(pVVar1,0x46,iVar7 * iVar3 * 3);
      }
      else if (CVar4 == CBA_BOX_ROTL) {
        iVar7 = Cba_ObjRangeSize(pCStack_10,s);
        pCVar2 = pCStack_10;
        iVar3 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar3 = Cba_ObjRangeSize(pCVar2,iVar3);
        uVar5 = Cba_ObjRangeSize(pCStack_10,s);
        iVar8 = Abc_Base2Log(uVar5);
        iVar3 = Abc_MinInt(iVar3,iVar8);
        Vec_IntAddToEntry(pVVar1,0x45,iVar7 * iVar3 * 3);
      }
      else if (CVar4 == CBA_BOX_INV) {
        Vec_IntAddToEntry(_nCountRange,9,0);
      }
      else if (CVar4 == CBA_BOX_AND) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,10,iVar7);
      }
      else if (CVar4 == CBA_BOX_OR) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,0xc,iVar7);
      }
      else if (CVar4 == CBA_BOX_XOR) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,0xe,iVar7 * 3);
      }
      else if (CVar4 == CBA_BOX_SLICE) {
        Vec_IntAddToEntry(_nCountRange,0x58,0);
      }
      else if (CVar4 == CBA_BOX_CONCAT) {
        Vec_IntAddToEntry(_nCountRange,0x59,0);
      }
      else if (CVar4 == CBA_BOX_LNOT) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,0x21,iVar7 + -1);
      }
      else if (CVar4 == CBA_BOX_LAND) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        pCVar2 = pCStack_10;
        iVar3 = Cba_ObjFinFon(pCStack_10,s,1);
        iVar3 = Cba_ObjRangeSize(pCVar2,iVar3);
        Vec_IntAddToEntry(pVVar1,0x22,iVar7 + iVar3 + -1);
      }
      else if (CVar4 == CBA_BOX_LOR) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        pCVar2 = pCStack_10;
        iVar3 = Cba_ObjFinFon(pCStack_10,s,1);
        iVar3 = Cba_ObjRangeSize(pCVar2,iVar3);
        Vec_IntAddToEntry(pVVar1,0x24,iVar7 + iVar3 + -1);
      }
      else if (CVar4 == CBA_BOX_LXOR) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        pCVar2 = pCStack_10;
        iVar3 = Cba_ObjFinFon(pCStack_10,s,1);
        iVar3 = Cba_ObjRangeSize(pCVar2,iVar3);
        Vec_IntAddToEntry(pVVar1,0x26,iVar7 + iVar3 + 1);
      }
      else if (CVar4 == CBA_BOX_EQU) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,0x3f,iVar7 * 4 + -1);
      }
      else if (CVar4 == CBA_BOX_NEQU) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,0x40,iVar7 * 4 + -1);
      }
      else if (CVar4 == CBA_BOX_LTHAN) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,0x3b,iVar7 * 6 + -6);
      }
      else if (CVar4 == CBA_BOX_MTHAN) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,0x3e,iVar7 * 6 + -6);
      }
      else if (CVar4 == CBA_BOX_LETHAN) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,0x3c,iVar7 * 6 + -6);
      }
      else if (CVar4 == CBA_BOX_METHAN) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,0x3d,iVar7 * 6 + -6);
      }
      else if (CVar4 == CBA_BOX_RAND) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,0x1b,iVar7 + -1);
      }
      else if (CVar4 == CBA_BOX_ROR) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,0x1d,iVar7 + -1);
      }
      else if (CVar4 == CBA_BOX_RXOR) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,0x1f,iVar7 * 3 + -3);
      }
      else if (CVar4 == CBA_BOX_ADD) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,0x2f,iVar7 * 9);
      }
      else if (CVar4 == CBA_BOX_SUB) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,0x30,iVar7 * 9);
      }
      else if (CVar4 == CBA_BOX_MUL) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        pCVar2 = pCStack_10;
        iVar3 = Cba_ObjFinFon(pCStack_10,s,1);
        iVar3 = Cba_ObjRangeSize(pCVar2,iVar3);
        Vec_IntAddToEntry(pVVar1,0x31,iVar7 * 9 * iVar3);
      }
      else if (CVar4 == CBA_BOX_DIV) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        pCVar2 = pCStack_10;
        iVar3 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar3 = Cba_ObjRangeSize(pCVar2,iVar3);
        pCVar2 = pCStack_10;
        iVar8 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar8 = Cba_ObjRangeSize(pCVar2,iVar8);
        Vec_IntAddToEntry(pVVar1,0x33,iVar7 * 0xd * iVar3 + iVar8 * -0x13 + 10);
      }
      else if (CVar4 == CBA_BOX_MOD) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        pCVar2 = pCStack_10;
        iVar3 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar3 = Cba_ObjRangeSize(pCVar2,iVar3);
        pCVar2 = pCStack_10;
        iVar8 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar8 = Cba_ObjRangeSize(pCVar2,iVar8);
        Vec_IntAddToEntry(pVVar1,0x34,iVar7 * 0xd * iVar3 + iVar8 * -7 + -2);
      }
      else if (CVar4 == CBA_BOX_POW) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        pCVar2 = pCStack_10;
        iVar3 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar3 = Cba_ObjRangeSize(pCVar2,iVar3);
        dVar13 = pow((double)iVar7,(double)iVar3);
        Vec_IntAddToEntry(pVVar1,0x36,(int)dVar13 * 10);
      }
      else if (CVar4 == CBA_BOX_MIN) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        Vec_IntAddToEntry(pVVar1,0x37,iVar7 << 2);
      }
      else if (CVar4 == CBA_BOX_SQRT) {
        iVar7 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar7 = Cba_ObjRangeSize(pCVar2,iVar7);
        pCVar2 = pCStack_10;
        iVar3 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar3 = Cba_ObjRangeSize(pCVar2,iVar3);
        pCVar2 = pCStack_10;
        iVar8 = Cba_ObjFinFon(pCStack_10,s,0);
        iVar8 = Cba_ObjRangeSize(pCVar2,iVar8);
        Vec_IntAddToEntry(pVVar1,0x38,(iVar7 * 0xb * iVar3) / 8 + (iVar8 * 5) / 2 + -5);
      }
    }
    s = s + 1;
  } while( true );
}

Assistant:

void Cba_NtkPrintDistrib( Cba_Ntk_t * p, int fVerbose )
{
    Vec_Ptr_t * vTypes, * vOccurs;
    Vec_Int_t * vAnds = Vec_IntStart( CBA_BOX_LAST );
    int iRnObj = -1, nCountRange = 0;
    int i, k, s, s0, s1;  word Sign;
    Cba_ObjType_t Type;
    char * pTypeNames[CBA_BOX_LAST];
    Cba_ManCreatePrimMap( pTypeNames );
    // allocate statistics arrays
    vTypes  = Vec_PtrStart( CBA_BOX_LAST );
    vOccurs = Vec_PtrStart( CBA_BOX_LAST );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
        Vec_PtrWriteEntry( vTypes, i, Vec_WrdAlloc(16) );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
        Vec_PtrWriteEntry( vOccurs, i, Vec_WrdAlloc(16) );
    // add nodes
    Cba_NtkForEachObj( p, i )
    {
//        char * pName = Cba_ObjName(p, i);
        Type = Cba_ObjType( p, i );
        if ( Cba_ObjSign(p, i) > 0x1FFFFF )
            printf( "Object %6d has range %d, which is reduced to %d in the statistics.\n", 
                i, Cba_ObjRangeSize(p, i), Cba_ObjRangeSize(p, i) & 0xFFFFF );
        if ( Cba_ObjLeft(p, i) && Cba_ObjRight(p, i) )
        {
            if ( iRnObj == -1 )
                iRnObj = 1;
            nCountRange++;
        }
        // 0-input types
        if ( Cba_ObjIsPi(p, i) || (Type == CBA_BOX_BUF && Cba_FonIsConst(Cba_ObjFinFon(p, i, 0))) || Type == CBA_BOX_CONCAT )
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), 0, 0 );
        // 1-input types
        else if ( Cba_TypeIsUnary(Type)  )
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 0)), 0 );
        // 2-input types (including MUX)
        else if ( Cba_ObjFinNum(p, i) == 1 )
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 0)), 0 );
        else
        {
            assert( Cba_ObjFinNum(p, i) >= 2 );
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 0)), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 1)) );
        }
        // add to storage
        Cba_NtkPrintDistribAddOne( vTypes, vOccurs, Type, Sign );
        // count the number of AIG nodes
        if ( Type == CBA_BOX_MUX )
            Vec_IntAddToEntry( vAnds, CBA_BOX_MUX,      3 * Cba_ObjRangeSize(p, i) * (Cba_ObjFinNum(p, i) - 2) );
        else if ( Type == CBA_BOX_SHIR )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHIR,  Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_SHIRA )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHIRA, Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_SHIL )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHIL,  Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_SHILA )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHILA, Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_ROTR )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_ROTR,  Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_ROTL )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_ROTL,  Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_INV )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_INV, 0 );
        else if ( Type == CBA_BOX_AND )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_AND,         Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_OR )       
            Vec_IntAddToEntry( vAnds, CBA_BOX_OR,          Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_XOR )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_XOR,     3 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_SLICE )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_SLICE, 0 );
        else if ( Type == CBA_BOX_CONCAT )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_CONCAT, 0 );
        else if ( Type == CBA_BOX_LNOT )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LNOT,        Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_LAND )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LAND,        Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) - 1 );
        else if ( Type == CBA_BOX_LOR )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_LOR,         Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) - 1 );
        else if ( Type == CBA_BOX_LXOR )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LXOR,        Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) + 1 );
        else if ( Type == CBA_BOX_EQU )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_EQU,      4 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_NEQU )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_NEQU,     4 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_LTHAN )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LTHAN,    6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_MTHAN )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_MTHAN,    6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_LETHAN ) 
            Vec_IntAddToEntry( vAnds, CBA_BOX_LETHAN,   6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_METHAN ) 
            Vec_IntAddToEntry( vAnds, CBA_BOX_METHAN,   6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_RAND )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_RAND,         Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_ROR )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_ROR,          Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_RXOR )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_RXOR,     3 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 3 );
        else if ( Type == CBA_BOX_ADD )       
            Vec_IntAddToEntry( vAnds, CBA_BOX_ADD,      9 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_SUB )       
            Vec_IntAddToEntry( vAnds, CBA_BOX_SUB,      9 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_MUL )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_MUL,      9 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) );
        else if ( Type == CBA_BOX_DIV )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_DIV,     13 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 19 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + 10 );
        else if ( Type == CBA_BOX_MOD )  
            Vec_IntAddToEntry( vAnds, CBA_BOX_MOD,     13 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 7 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 2  );
        else if ( Type == CBA_BOX_POW ) 
            Vec_IntAddToEntry( vAnds, CBA_BOX_POW,     10 * (int)pow((double)Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)),(double)Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0))) );
        else if ( Type == CBA_BOX_MIN )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_MIN,      4 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_SQRT )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_SQRT,    11 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) / 8 + 5 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) / 2 - 5  );
    }
    if ( nCountRange )
    {
        printf( "Warning: %d objects of the design have non-zero-based ranges.\n", nCountRange );
        printf( "In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n", 
            iRnObj, Cba_FonNameStr(p, Cba_ObjFon0(p, iRnObj)), 
            Cba_ObjRangeSize(p, iRnObj), Cba_ObjLeft(p, iRnObj), Cba_ObjRight(p, iRnObj) );
    }
    // print by occurrence
    printf( "ID  :  name  occurrence    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n" );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
    {
        Vec_Wrd_t * vType  = (Vec_Wrd_t *)Vec_PtrEntry( vTypes, i );
        Vec_Wrd_t * vOccur = (Vec_Wrd_t *)Vec_PtrEntry( vOccurs, i );
        if ( p->pDesign->nObjs[i] == 0 )
            continue;
        printf( "%2d  :  %-8s  %6d%8d ", i, pTypeNames[i], p->pDesign->nObjs[i], Vec_IntEntry(vAnds, i) );
        // sort by occurence
        Cba_NtkPrintDistribSortOne( vTypes, vOccurs, i );
        Vec_WrdForEachEntry( vType, Sign, k )
        {
            Cba_NtkPrintDistribFromSign( Sign, &s, &s0, &s1 );
            if ( ((k % 6) == 5 && s1) || ((k % 8) == 7 && !s1) )
                printf( "\n                                " );
            printf( "(%d)", (int)Vec_WrdEntry( vOccur, k ) );
            printf( "%s%d",      Abc_LitIsCompl(s)?"-":"",  Abc_Lit2Var(s) );
            if ( s0 )
                printf( "=%s%d", Abc_LitIsCompl(s0)?"-":"", Abc_Lit2Var(s0) );
            if ( s1 )
                printf( ".%s%d", Abc_LitIsCompl(s1)?"-":"", Abc_Lit2Var(s1) );
            printf( " " );
        }
        printf( "\n" );
    }
    Vec_VecFree( (Vec_Vec_t *)vTypes );
    Vec_VecFree( (Vec_Vec_t *)vOccurs );
    Vec_IntFree( vAnds );
}